

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::
make_exception<const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>::
operator()(make_exception<const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
           *this,stringstream *msg,char *arg,time_point args,char *args_1,time_point args_2)

{
  make_exception<hta::Clock::time_point,_const_char_*,_hta::Clock::time_point> local_21;
  
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>::operator()
            (&local_21,msg,args,args_1,args_2);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }